

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

int mbedtls_pk_setup(mbedtls_pk_context *ctx,mbedtls_pk_info_t *info)

{
  long lVar1;
  long in_RSI;
  long *in_RDI;
  int local_4;
  
  if ((in_RSI == 0) || (*in_RDI != 0)) {
    local_4 = -16000;
  }
  else {
    if (*(long *)(in_RSI + 0x48) != 0) {
      lVar1 = (**(code **)(in_RSI + 0x48))();
      in_RDI[1] = lVar1;
      if (lVar1 == 0) {
        return -0x3f80;
      }
    }
    *in_RDI = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mbedtls_pk_setup(mbedtls_pk_context *ctx, const mbedtls_pk_info_t *info)
{
    if (info == NULL || ctx->pk_info != NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if ((info->ctx_alloc_func != NULL) &&
        ((ctx->pk_ctx = info->ctx_alloc_func()) == NULL)) {
        return MBEDTLS_ERR_PK_ALLOC_FAILED;
    }

    ctx->pk_info = info;

    return 0;
}